

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef.c
# Opt level: O3

void av1_cdef_init_fb_row
               (AV1_COMMON *cm,MACROBLOCKD *xd,CdefBlockInfo *fb_info,uint16_t **linebuf,
               uint16_t *src,AV1CdefSyncData *cdef_sync,int fbr)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  SequenceHeader *pSVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint16_t *puVar8;
  uint16_t *puVar9;
  ulong uVar10;
  int iVar11;
  _func_void_uint16_t_ptr_int_uint16_t_ptr_int_int_int **pp_Var12;
  int iVar13;
  int iVar14;
  int *piVar15;
  bool bVar16;
  
  pSVar4 = cm->seq_params;
  uVar1 = pSVar4->monochrome;
  iVar11 = (cm->mi_params).mi_rows;
  iVar2 = (cm->mi_params).mi_cols;
  iVar7 = iVar11 + 0xf;
  iVar11 = iVar11 + 0x1e;
  if (-1 < iVar7) {
    iVar11 = iVar7;
  }
  fb_info->frame_boundary[0] = (uint)(fbr == 0);
  iVar11 = (iVar11 >> 4) + -1;
  iVar7 = fbr * 0x10 + 0x10;
  uVar5 = 1;
  if (iVar11 != fbr) {
    uVar5 = (uint)(iVar7 == (cm->mi_params).mi_rows);
  }
  fb_info->frame_boundary[2] = uVar5;
  fb_info->src = src;
  fb_info->damping = (cm->cdef_info).cdef_damping;
  fb_info->coeff_shift = pSVar4->bit_depth - AOM_BITS_8;
  uVar5 = fbr * 2 & 2;
  uVar6 = uVar5 ^ 2;
  memset(fb_info->dir,0,0x800);
  piVar15 = &xd->plane[0].dst.stride;
  uVar10 = 0;
  while( true ) {
    iVar13 = iVar7 << (2U - (char)piVar15[-8] & 0x1f);
    iVar14 = (int)(iVar2 * 4 + 0xfU & 0xfffffff0) >> (*(byte *)(piVar15 + -9) & 0x1f);
    puVar9 = linebuf[uVar10];
    fb_info->bot_linebuf[uVar10] = puVar9 + iVar14 * 4;
    if (iVar11 == fbr) {
      fb_info->top_linebuf[uVar10] = linebuf[uVar10] + (int)(iVar14 * uVar6);
    }
    else {
      iVar3 = *piVar15;
      if (cm->seq_params->use_highbitdepth == '\0') {
        puVar8 = (uint16_t *)(((buf_2d *)(piVar15 + -6))->buf + (long)(iVar13 + -2) * (long)iVar3);
        pp_Var12 = (_func_void_uint16_t_ptr_int_uint16_t_ptr_int_int_int **)
                   &cdef_copy_rect8_8bit_to_16bit;
      }
      else {
        puVar8 = (uint16_t *)
                 ((long)(iVar13 + -2) * (long)iVar3 * 2 + (long)((buf_2d *)(piVar15 + -6))->buf * 2)
        ;
        pp_Var12 = &cdef_copy_rect8_16bit_to_16bit;
      }
      (**pp_Var12)(puVar9 + (int)(iVar14 * uVar5),iVar14,puVar8,iVar3,iVar14,2);
      fb_info->top_linebuf[uVar10] = linebuf[uVar10] + (int)(iVar14 * uVar6);
      iVar3 = *piVar15;
      if (cm->seq_params->use_highbitdepth == '\0') {
        puVar9 = (uint16_t *)(((buf_2d *)(piVar15 + -6))->buf + (long)iVar13 * (long)iVar3);
        pp_Var12 = (_func_void_uint16_t_ptr_int_uint16_t_ptr_int_int_int **)
                   &cdef_copy_rect8_8bit_to_16bit;
      }
      else {
        puVar9 = (uint16_t *)
                 ((long)iVar13 * (long)iVar3 * 2 + (long)((buf_2d *)(piVar15 + -6))->buf * 2);
        pp_Var12 = &cdef_copy_rect8_16bit_to_16bit;
      }
      (**pp_Var12)(fb_info->bot_linebuf[uVar10],iVar14,puVar9,iVar3,iVar14,2);
    }
    if (uVar1 != '\0') break;
    piVar15 = piVar15 + 0x28c;
    bVar16 = 1 < uVar10;
    uVar10 = uVar10 + 1;
    if (bVar16) {
      return;
    }
  }
  return;
}

Assistant:

void av1_cdef_init_fb_row(const AV1_COMMON *const cm,
                          const MACROBLOCKD *const xd,
                          CdefBlockInfo *const fb_info,
                          uint16_t **const linebuf, uint16_t *const src,
                          struct AV1CdefSyncData *const cdef_sync, int fbr) {
  (void)cdef_sync;
  const int num_planes = av1_num_planes(cm);
  const int nvfb = (cm->mi_params.mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;
  const int luma_stride =
      ALIGN_POWER_OF_TWO(cm->mi_params.mi_cols << MI_SIZE_LOG2, 4);
  const bool ping_pong = fbr & 1;
  // for the current filter block, it's top left corner mi structure (mi_tl)
  // is first accessed to check whether the top and left boundaries are
  // frame boundaries. Then bottom-left and top-right mi structures are
  // accessed to check whether the bottom and right boundaries
  // (respectively) are frame boundaries.
  //
  // Note that we can't just check the bottom-right mi structure - eg. if
  // we're at the right-hand edge of the frame but not the bottom, then
  // the bottom-right mi is NULL but the bottom-left is not.
  fb_info->frame_boundary[TOP] = (MI_SIZE_64X64 * fbr == 0) ? 1 : 0;
  if (fbr != nvfb - 1)
    fb_info->frame_boundary[BOTTOM] =
        (MI_SIZE_64X64 * (fbr + 1) == cm->mi_params.mi_rows) ? 1 : 0;
  else
    fb_info->frame_boundary[BOTTOM] = 1;

  fb_info->src = src;
  fb_info->damping = cm->cdef_info.cdef_damping;
  fb_info->coeff_shift = AOMMAX(cm->seq_params->bit_depth - 8, 0);
  av1_zero(fb_info->dir);
  av1_zero(fb_info->var);

  for (int plane = 0; plane < num_planes; plane++) {
    const int mi_high_l2 = MI_SIZE_LOG2 - xd->plane[plane].subsampling_y;
    const int offset = MI_SIZE_64X64 * (fbr + 1) << mi_high_l2;
    const int stride = luma_stride >> xd->plane[plane].subsampling_x;
    // here ping-pong buffers are maintained for top linebuf
    // to avoid linebuf over-write by consecutive row.
    uint16_t *const top_linebuf =
        &linebuf[plane][ping_pong * CDEF_VBORDER * stride];
    fb_info->bot_linebuf[plane] = &linebuf[plane][(CDEF_VBORDER << 1) * stride];

    if (fbr != nvfb - 1)  // top line buffer copy
      av1_cdef_copy_sb8_16(cm, top_linebuf, stride, xd->plane[plane].dst.buf,
                           offset - CDEF_VBORDER, 0,
                           xd->plane[plane].dst.stride, CDEF_VBORDER, stride);
    fb_info->top_linebuf[plane] =
        &linebuf[plane][(!ping_pong) * CDEF_VBORDER * stride];

    if (fbr != nvfb - 1)  // bottom line buffer copy
      av1_cdef_copy_sb8_16(cm, fb_info->bot_linebuf[plane], stride,
                           xd->plane[plane].dst.buf, offset, 0,
                           xd->plane[plane].dst.stride, CDEF_VBORDER, stride);
  }
}